

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O2

void Assimp::SceneCombiner::OffsetNodeMeshIndices(aiNode *node,uint offset)

{
  uint i;
  ulong uVar1;
  uint i_1;
  
  for (uVar1 = 0; uVar1 < node->mNumMeshes; uVar1 = uVar1 + 1) {
    node->mMeshes[uVar1] = node->mMeshes[uVar1] + offset;
  }
  for (uVar1 = 0; uVar1 < node->mNumChildren; uVar1 = uVar1 + 1) {
    OffsetNodeMeshIndices(node->mChildren[uVar1],offset);
  }
  return;
}

Assistant:

void SceneCombiner::OffsetNodeMeshIndices (aiNode* node, unsigned int offset) {
    for (unsigned int i = 0; i < node->mNumMeshes;++i)
        node->mMeshes[i] += offset;

    for ( unsigned int i = 0; i < node->mNumChildren; ++i ) {
        OffsetNodeMeshIndices( node->mChildren[ i ], offset );
    }
}